

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

int vrna_params_load(char *fname,uint options)

{
  int iVar1;
  FILE *__stream;
  void *p;
  char *pcVar2;
  char **file_content;
  char **ppcVar3;
  long lVar4;
  long lVar5;
  
  __stream = fopen(fname,"r");
  if (__stream == (FILE *)0x0) {
    iVar1 = 0;
    vrna_message_warning("read_parameter_file():Can\'t open file %s\n",fname);
  }
  else {
    p = vrna_alloc(0x40000);
    pcVar2 = vrna_read_line((FILE *)__stream);
    if (pcVar2 == (char *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar4 = 0x8000;
      lVar5 = 0;
      do {
        if (lVar5 == lVar4) {
          lVar4 = lVar4 + 0x8000;
          p = vrna_realloc(p,(int)lVar4 * 8);
        }
        *(char **)((long)p + lVar5 * 8) = pcVar2;
        lVar5 = lVar5 + 1;
        pcVar2 = vrna_read_line((FILE *)__stream);
      } while (pcVar2 != (char *)0x0);
    }
    file_content = (char **)vrna_realloc(p,(int)lVar5 * 8 + 8);
    file_content[lVar5] = (char *)0x0;
    fclose(__stream);
    pcVar2 = vrna_basename(fname);
    iVar1 = set_parameters_from_string(file_content,pcVar2);
    free(pcVar2);
    pcVar2 = *file_content;
    ppcVar3 = file_content;
    while (pcVar2 != (char *)0x0) {
      ppcVar3 = ppcVar3 + 1;
      free(pcVar2);
      pcVar2 = *ppcVar3;
    }
    free(file_content);
  }
  return iVar1;
}

Assistant:

PUBLIC int
vrna_params_load(const char   fname[],
                 unsigned int options)
{
  char  *name, **file_content, **ptr;
  int   ret;

  ret           = 0;
  file_content  = file2array(fname);

  if (file_content) {
    name = vrna_basename(fname);

    ret = set_parameters_from_string(file_content,
                                     (const char *)name);

    free(name);
    for (ptr = file_content; *ptr != NULL; ptr++)
      free(*ptr);

    free(file_content);
  }

  return ret;
}